

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3VdbeMemSetNull(Mem *pMem)

{
  RowSet *pRVar1;
  VdbeFrame *pFrame;
  Mem *pMem_local;
  
  if ((pMem->flags & 0x40) != 0) {
    pRVar1 = (pMem->u).pRowSet;
    pRVar1->db = (sqlite3 *)pRVar1->pChunk->aEntry[9].pRight;
    pRVar1->pChunk->aEntry[9].pRight = (RowSetEntry *)pRVar1;
  }
  if ((pMem->flags & 0x20) != 0) {
    sqlite3RowSetClear((pMem->u).pRowSet);
  }
  pMem->flags = pMem->flags & 0xbe00 | 1;
  pMem->type = '\x05';
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemSetNull(Mem *pMem){
  if( pMem->flags & MEM_Frame ){
    VdbeFrame *pFrame = pMem->u.pFrame;
    pFrame->pParent = pFrame->v->pDelFrame;
    pFrame->v->pDelFrame = pFrame;
  }
  if( pMem->flags & MEM_RowSet ){
    sqlite3RowSetClear(pMem->u.pRowSet);
  }
  MemSetTypeFlag(pMem, MEM_Null);
  pMem->type = SQLITE_NULL;
}